

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disp_repository.cpp
# Opt level: O0

void __thiscall so_5::impl::disp_repository_t::send_shutdown_signal(disp_repository_t *this)

{
  bool bVar1;
  pointer ppVar2;
  element_type *peVar3;
  _Self local_20;
  iterator it_end;
  iterator it;
  disp_repository_t *this_local;
  
  it_end = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<so_5::dispatcher_t>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<so_5::dispatcher_t>_>_>_>
           ::begin(&this->m_named_dispatcher_map);
  local_20._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<so_5::dispatcher_t>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<so_5::dispatcher_t>_>_>_>
       ::end(&this->m_named_dispatcher_map);
  while( true ) {
    bVar1 = std::operator!=(&it_end,&local_20);
    if (!bVar1) break;
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<so_5::dispatcher_t>_>_>
             ::operator->(&it_end);
    peVar3 = std::__shared_ptr_access<so_5::dispatcher_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<so_5::dispatcher_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&ppVar2->second);
    (*peVar3->_vptr_dispatcher_t[3])();
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<so_5::dispatcher_t>_>_>
    ::operator++(&it_end);
  }
  return;
}

Assistant:

void
disp_repository_t::send_shutdown_signal()
{
	named_dispatcher_map_t::iterator it = m_named_dispatcher_map.begin();
	named_dispatcher_map_t::iterator it_end = m_named_dispatcher_map.end();

	for( ; it != it_end; ++it )
	{
		it->second->shutdown();
	}
}